

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Instr * __thiscall
flow::IRBuilder::createStore(IRBuilder *this,Value *lhs,ConstantInt *index,Value *rhs,string *name)

{
  Instr *pIVar1;
  long local_78;
  string local_50;
  string *local_30;
  string *name_local;
  Value *rhs_local;
  ConstantInt *index_local;
  Value *lhs_local;
  IRBuilder *this_local;
  
  local_30 = name;
  name_local = (string *)rhs;
  rhs_local = (Value *)index;
  index_local = (ConstantInt *)lhs;
  lhs_local = (Value *)this;
  if (lhs == (Value *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(lhs,&Value::typeinfo,&AllocaInstr::typeinfo,0);
  }
  if (local_78 == 0) {
    __assert_fail("dynamic_cast<AllocaInstr*>(lhs) && \"lhs must be of type AllocaInstr in order to STORE to.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x7d,
                  "Instr *flow::IRBuilder::createStore(Value *, ConstantInt *, Value *, const std::string &)"
                 );
  }
  makeName(&local_50,this,local_30);
  pIVar1 = &insert<flow::StoreInstr,flow::Value*&,flow::ConstantValue<long,(flow::LiteralType)2>*&,flow::Value*&,std::__cxx11::string>
                      (this,(Value **)&index_local,
                       (ConstantValue<long,_(flow::LiteralType)2> **)&rhs_local,
                       (Value **)&name_local,&local_50)->super_Instr;
  std::__cxx11::string::~string((string *)&local_50);
  return pIVar1;
}

Assistant:

Instr* IRBuilder::createStore(Value* lhs, ConstantInt* index, Value* rhs,
                              const std::string& name) {
  assert(dynamic_cast<AllocaInstr*>(lhs) &&
         "lhs must be of type AllocaInstr in order to STORE to.");
  // assert(lhs->type() == rhs->type() && "Type of lhs and rhs must be equal.");
  // assert(dynamic_cast<IRVariable*>(lhs) && "lhs must be of type Variable.");

  return insert<StoreInstr>(lhs, index, rhs, makeName(name));
}